

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O0

void TypeCheck_AndOperator(KonohaContext *kctx,KonohaStack *sfp)

{
  KClass *reqClass;
  KonohaStack *in_RSI;
  KonohaContext *in_RDI;
  kNode *returnNode;
  kNode *stmt;
  KClass *reqc;
  kNameSpace *ns;
  kNode *expr;
  kNode *local_38;
  int pol;
  kNameSpace *ns_00;
  
  ns_00 = in_RSI[1].field_0.asNameSpace;
  reqClass = (KClass *)kNode_GetNameSpace(in_RDI,(kNode *)ns_00);
  pol = (int)((ulong)((in_RSI[3].field_0.asObject)->h).ct >> 0x20);
  (*(in_RDI->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"TypeCheck_AndOperator",0x1a1,"tracing..");
  local_38 = TypeCheckNodeAt((KonohaContext *)returnNode,(kNode *)in_RDI,(size_t)in_RSI,ns_00,
                             reqClass,pol);
  if ((local_38->nodeType != 0x18) &&
     (local_38 = TypeCheckNodeAt((KonohaContext *)returnNode,(kNode *)in_RDI,(size_t)in_RSI,ns_00,
                                 reqClass,pol), local_38->nodeType != 0x18)) {
    local_38 = kNode_Type((kNode *)ns_00,10,3);
  }
  in_RSI[-4].field_0.asNode = local_38;
  (*in_RDI->klib->CheckSafePoint)(in_RDI,in_RSI,0);
  return;
}

Assistant:

static KMETHOD TypeCheck_AndOperator(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_TypeCheck2(stmt, expr, ns, reqc);
	kNode *returnNode = TypeCheckNodeAt(kctx, expr, 1, ns, KClass_Boolean, 0);
	if(!kNode_IsError(returnNode)) {
		returnNode = TypeCheckNodeAt(kctx, expr, 2, ns, KClass_Boolean, 0);
		if(!kNode_IsError(returnNode)) {
			returnNode = kNode_Type(expr, KNode_And, KType_Boolean);
		}
	}
	KReturn(returnNode);
}